

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O0

void __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
deallocate_page<(density::detail::page_allocation_type)1>
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,void *i_page)

{
  PageAllocatorSlot *pPVar1;
  bool bVar2;
  bool bVar3;
  PageFooter *i_page_00;
  WF_PageStack *this_00;
  __pointer_type pPVar4;
  PageStack *this_01;
  bool done;
  PageAllocatorSlot *original_slot;
  PageFooter *page;
  void *i_page_local;
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *this_local;
  
  process_pending_unpins(this,progress_wait_free);
  i_page_00 = get_footer(i_page);
  pPVar1 = this->m_current_slot;
  bVar2 = false;
  do {
    this_00 = PageAllocatorSlot::get_stack(this->m_current_slot,zeroed);
    bVar3 = WF_PageStack::try_push(this_00,i_page_00);
    if (bVar3) {
      bVar2 = true;
      break;
    }
    pPVar4 = std::atomic<density::detail::PageAllocatorSlot_*>::load
                       (&this->m_current_slot->m_next_slot,memory_order_seq_cst);
    this->m_current_slot = pPVar4;
  } while (this->m_current_slot != pPVar1);
  if (!bVar2) {
    this_01 = get_private_stack(this,zeroed);
    PageStack::push(this_01,i_page_00);
  }
  return;
}

Assistant:

void deallocate_page(void * i_page) noexcept
            {
                process_pending_unpins(progress_wait_free);

                auto const page = get_footer(i_page);

                // try to push the page once on every slot
                auto * const original_slot = m_current_slot;
                bool         done          = false;
                do
                {

                    if (m_current_slot->get_stack(ALLOCATION_TYPE).try_push(page))
                    {
                        done = true;
                        break;
                    }

                    m_current_slot = m_current_slot->m_next_slot.load();
                } while (m_current_slot != original_slot);

                // this is unlikely, but it may happen
                if (!done)
                {
                    get_private_stack(ALLOCATION_TYPE).push(page);
                }
            }